

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O2

_binbuf * pointertobinbuf(t_pd *x,t_gpointer *gp,t_symbol *s,char *fname)

{
  t_gstub *ptVar1;
  int iVar2;
  t_symbol *s_00;
  t_template *x_00;
  long lVar3;
  char *pcVar4;
  char *fmt;
  char *pcVar5;
  int type;
  int onset;
  t_symbol *arraytype;
  
  s_00 = gpointer_gettemplatesym(gp);
  if (s_00 == (t_symbol *)0x0) {
    pd_error(x,"%s: bad pointer",fname);
  }
  else {
    ptVar1 = gp->gp_stub;
    x_00 = template_findbyname(s_00);
    if (x_00 == (t_template *)0x0) {
      pd_error(x,"%s: couldn\'t find template %s",fname,s_00->s_name);
    }
    else {
      iVar2 = template_find_field(x_00,s,&onset,&type,&arraytype);
      if (iVar2 == 0) {
        pcVar4 = s_00->s_name;
        pcVar5 = s->s_name;
        fmt = "%s: %s.%s: no such field";
      }
      else {
        if (type == 2) {
          lVar3 = 0x18;
          if (ptVar1->gs_which == 2) {
            lVar3 = 0;
          }
          return *(_binbuf **)
                  ((long)((gp->gp_un).gp_scalar)->sc_vec + (long)onset * 8 + lVar3 + -0x18);
        }
        pcVar4 = s_00->s_name;
        pcVar5 = s->s_name;
        fmt = "%s: %s.%s: not a list";
      }
      pd_error(x,fmt,fname,pcVar4,pcVar5);
    }
  }
  return (_binbuf *)0x0;
}

Assistant:

t_binbuf *pointertobinbuf(t_pd *x, t_gpointer *gp, t_symbol *s,
    const char *fname)
{
    t_symbol *templatesym = gpointer_gettemplatesym(gp), *arraytype;
    t_template *template;
    int onset, type;
    t_binbuf *b;
    t_gstub *gs = gp->gp_stub;
    t_word *vec;
    if (!templatesym)
    {
        pd_error(x, "%s: bad pointer", fname);
        return (0);
    }
    if (!(template = template_findbyname(templatesym)))
    {
        pd_error(x, "%s: couldn't find template %s", fname,
            templatesym->s_name);
        return (0);
    }
    if (!template_find_field(template, s, &onset, &type, &arraytype))
    {
        pd_error(x, "%s: %s.%s: no such field", fname,
            templatesym->s_name, s->s_name);
        return (0);
    }
    if (type != DT_TEXT)
    {
        pd_error(x, "%s: %s.%s: not a list", fname,
            templatesym->s_name, s->s_name);
        return (0);
    }
    if (gs->gs_which == GP_ARRAY)
        vec = gp->gp_un.gp_w;
    else vec = gp->gp_un.gp_scalar->sc_vec;
    return (vec[onset].w_binbuf);
}